

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

QCborValueRef __thiscall QCborValue::operator[](QCborValue *this,QString *key)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  QCborContainerPrivate *pQVar3;
  QCborContainerPrivate *pQVar4;
  QStringView key_00;
  QCborValueConstRef QVar5;
  
  pcVar1 = (key->d).ptr;
  qVar2 = (key->d).size;
  if (*(int *)(this + 0x10) != 0xa0) {
    if (*(int *)(this + 0x10) == 0x80) {
      convertArrayToMap((QCborContainerPrivate **)(this + 8));
    }
    else {
      pQVar3 = *(QCborContainerPrivate **)(this + 8);
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
      *(undefined4 *)(this + 0x10) = 0xa0;
      if (pQVar3 != (QCborContainerPrivate *)0x0) {
        QCborContainerPrivate::deref(pQVar3);
      }
    }
  }
  *(undefined4 *)(this + 0x10) = 0xa0;
  *(undefined8 *)this = 0xffffffffffffffff;
  key_00.m_data = pcVar1;
  key_00.m_size = qVar2;
  QVar5 = (QCborValueConstRef)
          QCborContainerPrivate::findOrAddMapKey<QStringView>
                    (*(QCborContainerPrivate **)(this + 8),key_00);
  pQVar4 = QVar5.d;
  pQVar3 = *(QCborContainerPrivate **)(this + 8);
  if (pQVar3 != pQVar4) {
    if (pQVar3 != (QCborContainerPrivate *)0x0) {
      QCborContainerPrivate::deref(pQVar3);
    }
    if (pQVar4 != (QCborContainerPrivate *)0x0) {
      LOCK();
      (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar4->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    *(QCborContainerPrivate **)(this + 8) = pQVar4;
  }
  return (QCborValueRef)QVar5;
}

Assistant:

QCborValueRef QCborValue::operator[](const QString &key)
{
    return QCborContainerPrivate::findOrAddMapKey(*this, qToStringViewIgnoringNull(key));
}